

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O0

bool __thiscall crnlib::cfile_stream::flush(cfile_stream *this)

{
  bool bVar1;
  int iVar2;
  cfile_stream *this_local;
  
  if ((((this->super_data_stream).field_0x1a & 1) != 0) &&
     (bVar1 = data_stream::is_writable(&this->super_data_stream), bVar1)) {
    iVar2 = fflush((FILE *)this->m_pFile);
    if (iVar2 == -1) {
      data_stream::set_error(&this->super_data_stream);
      return false;
    }
    return true;
  }
  return false;
}

Assistant:

virtual bool flush()
        {
            if ((!m_opened) || (!is_writable()))
            {
                return false;
            }

            if (EOF == fflush(m_pFile))
            {
                set_error();
                return false;
            }

            return true;
        }